

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator __thiscall
QHash<QString,_QVariant>::findImpl<QString>(QHash<QString,_QVariant> *this,QString *key)

{
  piter it_00;
  bool bVar1;
  size_t bucket_00;
  QString *in_RDI;
  long in_FS_OFFSET;
  size_t bucket;
  Bucket it;
  Data<QHashPrivate::Node<QString,_QVariant>_> *in_stack_ffffffffffffff88;
  Data<QHashPrivate::Node<QString,_QVariant>_> *in_stack_ffffffffffffff90;
  Data<QHashPrivate::Node<QString,_QVariant>_> *in_stack_ffffffffffffffa0;
  Bucket local_38;
  Bucket local_28;
  piter local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = isEmpty((QHash<QString,_QVariant> *)in_RDI);
  if (bVar1) {
    local_18 = (piter)end((QHash<QString,_QVariant> *)in_RDI);
  }
  else {
    local_28.index = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    local_28.span = (Span *)&DAT_aaaaaaaaaaaaaaaa;
    local_28 = QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::findBucket<QString>
                         (in_stack_ffffffffffffffa0,in_RDI);
    bucket_00 = QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::Bucket::toBucketIndex
                          (&local_28,(Data<QHashPrivate::Node<QString,_QVariant>_> *)(in_RDI->d).d);
    detach((QHash<QString,_QVariant> *)in_stack_ffffffffffffff90);
    QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::Bucket::Bucket
              (&local_38,(Data<QHashPrivate::Node<QString,_QVariant>_> *)(in_RDI->d).d,bucket_00);
    bVar1 = QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::Bucket::isUnused
                      ((Bucket *)0x3d28db);
    if (bVar1) {
      local_18 = (piter)end((QHash<QString,_QVariant> *)in_RDI);
    }
    else {
      QHashPrivate::Data<QHashPrivate::Node<QString,_QVariant>_>::Bucket::toIterator
                ((Bucket *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      it_00.bucket = (size_t)in_RDI;
      it_00.d = in_stack_ffffffffffffff90;
      iterator::iterator((iterator *)in_stack_ffffffffffffff88,it_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_18;
  }
  __stack_chk_fail();
}

Assistant:

iterator findImpl(const K &key)
    {
        if (isEmpty()) // prevents detaching shared null
            return end();
        auto it = d->findBucket(key);
        size_t bucket = it.toBucketIndex(d);
        detach();
        it = typename Data::Bucket(d, bucket); // reattach in case of detach
        if (it.isUnused())
            return end();
        return iterator(it.toIterator(d));
    }